

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmGraphicsShaderTestUtil.cpp
# Opt level: O2

void vkt::SpirVAssembly::addShaderCodeCustomGeometry
               (SourceCollections *dst,InstanceContext *context)

{
  SpirVAsmSource *pSVar1;
  SpirVAsmCollection *this;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  passthru;
  allocator<char> local_89;
  string local_88;
  string local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  
  passthruFragments_abi_cxx11_();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"vert",&local_89);
  this = &dst->spirvAsmSources;
  pSVar1 = ::vk::ProgramCollection<vk::SpirVAsmSource>::add(this,&local_68);
  makeVertexShaderAssembly
            (&local_88,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_48);
  ::vk::operator<<(pSVar1,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"geom",&local_89);
  pSVar1 = ::vk::ProgramCollection<vk::SpirVAsmSource>::add(this,&local_68);
  makeGeometryShaderAssembly(&local_88,&context->testCodeFragments);
  ::vk::operator<<(pSVar1,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"frag",&local_89);
  pSVar1 = ::vk::ProgramCollection<vk::SpirVAsmSource>::add(this,&local_68);
  makeFragmentShaderAssembly
            (&local_88,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_48);
  ::vk::operator<<(pSVar1,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_48);
  return;
}

Assistant:

void addShaderCodeCustomGeometry(vk::SourceCollections& dst, InstanceContext context)
{
	map<string, string> passthru = passthruFragments();
	dst.spirvAsmSources.add("vert") << makeVertexShaderAssembly(passthru);
	dst.spirvAsmSources.add("geom") << makeGeometryShaderAssembly(context.testCodeFragments);
	dst.spirvAsmSources.add("frag") << makeFragmentShaderAssembly(passthru);
}